

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O1

int qEnvironmentVariableIntValue(char *varName,bool *ok)

{
  int iVar1;
  byte bVar2;
  optional<long_long> oVar3;
  
  oVar3 = qEnvironmentVariableIntegerValue(varName);
  bVar2 = 0;
  if ((long)oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
            super__Optional_payload_base<long_long>._M_payload._0_4_ ==
      oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
      super__Optional_payload_base<long_long>._M_payload) {
    bVar2 = oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
            super__Optional_payload_base<long_long>._M_engaged;
  }
  if (((undefined1  [16])
       oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    bVar2 = oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
            super__Optional_payload_base<long_long>._M_engaged;
  }
  if (ok != (bool *)0x0) {
    *ok = (bool)(bVar2 & 1);
  }
  iVar1 = 0;
  if ((bVar2 & 1) != 0) {
    iVar1 = oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
            super__Optional_payload_base<long_long>._M_payload._0_4_;
  }
  return iVar1;
}

Assistant:

int qEnvironmentVariableIntValue(const char *varName, bool *ok) noexcept
{
    std::optional<qint64> value = qEnvironmentVariableIntegerValue(varName);
    if (value && *value != int(*value))
        value = std::nullopt;
    if (ok)
        *ok = bool(value);
    return value.value_or(0);
}